

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsystem_netconf.c
# Opt level: O1

ssize_t netconf_read_until(LIBSSH2_CHANNEL *channel,char *endtag,char *buf,size_t buflen)

{
  ulong uVar1;
  char *__haystack;
  char *pcVar2;
  ulong uVar3;
  ssize_t sVar4;
  
  uVar3 = 0;
  memset(buf,0,0x100000);
  pcVar2 = (char *)0x0;
  do {
    uVar1 = libssh2_channel_read_ex(channel,0,buf + uVar3,0x100000 - uVar3);
    if (uVar1 != 0xffffffffffffffdb) {
      if ((long)uVar1 < 0) {
        fprintf(_stderr,"libssh2_channel_read: %d\n",uVar1 & 0xffffffff);
        goto LAB_00101af0;
      }
      uVar3 = uVar3 + uVar1;
      __haystack = strstr(buf,endtag);
      if (__haystack != (char *)0x0) {
        pcVar2 = strstr(__haystack,"]]>]]>");
      }
    }
  } while ((uVar3 < 0x100000) && (pcVar2 == (char *)0x0));
  if (pcVar2 == (char *)0x0) {
    netconf_read_until_cold_1();
LAB_00101af0:
    sVar4 = -1;
  }
  else {
    *pcVar2 = '\0';
    sVar4 = (long)pcVar2 - (long)buf;
  }
  return sVar4;
}

Assistant:

static ssize_t netconf_read_until(LIBSSH2_CHANNEL *channel, const char *endtag,
                                  char *buf, size_t buflen)
{
    ssize_t len;
    size_t rd = 0;
    char *endreply = NULL, *specialsequence = NULL;

    memset(buf, 0, buflen);

    do {
        len = libssh2_channel_read(channel, buf + rd, buflen - rd);
        if(LIBSSH2_ERROR_EAGAIN == len)
            continue;
        else if(len < 0) {
            fprintf(stderr, "libssh2_channel_read: %d\n", (int)len);
            return -1;
        }
        rd += len;

        /* read more data until we see a rpc-reply closing tag followed by
         * the special sequence ]]>]]> */

        /* really, this MUST be replaced with proper XML parsing! */

        endreply = strstr(buf, endtag);
        if(endreply)
            specialsequence = strstr(endreply, "]]>]]>");

    } while(!specialsequence && rd < buflen);

    if(!specialsequence) {
        fprintf(stderr, "netconf_read_until(): ]]>]]> not found!"
                        " read buffer too small?\n");
        return -1;
    }

    /* discard the special sequence so that only XML is returned */
    rd = specialsequence - buf;
    buf[rd] = 0;

    return rd;
}